

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> *
spvtools::opt::anon_unknown_15::GetAllTopLevelConstants
          (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
           *__return_storage_ptr__,SENode *node)

{
  pointer *pppSVar1;
  iterator __position;
  undefined8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined8 *puVar5;
  SEConstantNode *recurrent_node;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> local_38
  ;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*node->_vptr_SENode[4])(node);
  local_38.
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SEConstantNode *)
      local_38.
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (SEConstantNode *)0x0) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>::
      _M_realloc_insert<spvtools::opt::SEConstantNode*const&>
                ((vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>
                  *)__return_storage_ptr__,__position,(SEConstantNode **)&local_38);
    }
    else {
      *__position._M_current =
           (SEConstantNode *)
           local_38.
           super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pppSVar1 = &(__return_storage_ptr__->
                  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
  }
  iVar3 = (*node->_vptr_SENode[8])(node);
  lVar4 = CONCAT44(extraout_var_00,iVar3);
  if (lVar4 != 0) {
    puVar2 = *(undefined8 **)(lVar4 + 0x10);
    for (puVar5 = *(undefined8 **)(lVar4 + 8); puVar5 != puVar2; puVar5 = puVar5 + 1) {
      GetAllTopLevelConstants(&local_38,(SENode *)*puVar5);
      std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEConstantNode**,std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>>>
                ((vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_38.
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_38.
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if ((SEConstantNode *)
          local_38.
          super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (SEConstantNode *)0x0) {
        operator_delete(local_38.
                        super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SEConstantNode*> GetAllTopLevelConstants(SENode* node) {
  auto nodes = std::vector<SEConstantNode*>{};
  if (auto recurrent_node = node->AsSEConstantNode()) {
    nodes.push_back(recurrent_node);
  }

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      auto child_nodes = GetAllTopLevelConstants(child);
      nodes.insert(nodes.end(), child_nodes.begin(), child_nodes.end());
    }
  }

  return nodes;
}